

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.cc
# Opt level: O0

int __thiscall InvertDatabase::make_l2_pass(InvertDatabase *this)

{
  element_type *this_00;
  element_type *peVar1;
  reference pvVar2;
  reference pvVar3;
  int local_34;
  value_type_conflict4 local_30;
  int p;
  int local_28;
  int local_24;
  int high;
  int low;
  int num_class;
  int l2cnt;
  int j;
  int i;
  InvertDatabase *this_local;
  
  low = 0;
  _j = this;
  this_00 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &this->cls);
  high = ClassInfo::get_num_class(this_00);
  std::
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::resize(&this->set_sup,(long)this->numfreq);
  std::
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::resize(&this->seq_sup,(long)this->numfreq);
  local_24 = 0;
  while (local_24 < this->numfreq) {
    for (local_28 = local_24; local_28 < this->numfreq; local_28 = local_28 + 1) {
      peVar1 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->args);
      if ((1 < peVar1->max_iset_len) && (0 < (this->numfreq - local_28) + -1)) {
        pvVar2 = std::
                 vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                 ::operator[](&this->set_sup,(long)local_28);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::resize(pvVar2,(long)((this->numfreq - local_28) + -1));
        for (l2cnt = 0; l2cnt < (this->numfreq - local_28) + -1; l2cnt = l2cnt + 1) {
          pvVar2 = std::
                   vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                   ::operator[](&this->set_sup,(long)local_28);
          pvVar3 = std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator[](pvVar2,(long)l2cnt);
          p = 0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    (pvVar3,(long)high,(value_type_conflict4 *)&p);
        }
      }
      peVar1 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->args);
      if (1 < peVar1->max_seq_len) {
        pvVar2 = std::
                 vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                 ::operator[](&this->seq_sup,(long)local_28);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::resize(pvVar2,(long)this->numfreq);
        for (l2cnt = 0; l2cnt < this->numfreq; l2cnt = l2cnt + 1) {
          pvVar2 = std::
                   vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                   ::operator[](&this->seq_sup,(long)local_28);
          pvVar3 = std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator[](pvVar2,(long)l2cnt);
          local_30 = 0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    (pvVar3,(long)high,&local_30);
        }
      }
    }
    for (local_34 = 0;
        peVar1 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->args), local_34 < peVar1->num_partitions;
        local_34 = local_34 + 1) {
      process_invert(this,local_34);
    }
    get_F2(this,&low);
    local_24 = local_28;
  }
  return low;
}

Assistant:

int InvertDatabase::make_l2_pass() {
    int i, j;

    int l2cnt = 0;
    int num_class = cls->get_num_class();

    // support for 2-itemsets
    set_sup.resize(numfreq);
    seq_sup.resize(numfreq);

    int low, high;

    for (low = 0; low < numfreq; low = high) {
        for (high = low; high < numfreq; high++) {
            if (args->max_iset_len > 1 && numfreq - high - 1 > 0) {
                set_sup[high].resize(numfreq - high - 1);
                for (i = 0; i < numfreq - high - 1; i++) {
                    set_sup[high][i].resize(num_class, 0);
                }
            }
            if (args->max_seq_len > 1) {
                seq_sup[high].resize(numfreq);
                for (i = 0; i < numfreq; i++) {
                    seq_sup[high][i].resize(num_class, 0);
                }
            }
        }
        for (int p = 0; p < args->num_partitions; p++) {
            process_invert(p);
        }
        get_F2(l2cnt);
    }

    return l2cnt;
}